

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowDockMenu(ImDrawList *draw_list,ImVec2 p_min,float sz,ImU32 col)

{
  ImDrawList *draw_list_00;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImU32 local_20;
  float local_1c;
  ImU32 col_local;
  float sz_local;
  ImDrawList *draw_list_local;
  ImVec2 p_min_local;
  
  local_20 = col;
  local_1c = sz;
  _col_local = draw_list;
  draw_list_local = (ImDrawList *)p_min;
  ImVec2::ImVec2(&local_30,sz * 0.2,sz * 0.15);
  local_28 = ::operator+((ImVec2 *)&draw_list_local,&local_30);
  ImVec2::ImVec2(&local_40,local_1c * 0.8,local_1c * 0.3);
  local_38 = ::operator+((ImVec2 *)&draw_list_local,&local_40);
  ImDrawList::AddRectFilled(draw_list,&local_28,&local_38,local_20,0.0,0);
  draw_list_00 = _col_local;
  ImVec2::ImVec2(&local_50,local_1c * 0.5,local_1c * 0.85);
  local_48 = ::operator+((ImVec2 *)&draw_list_local,&local_50);
  ImVec2::ImVec2(&local_58,local_1c * 0.3,local_1c * 0.4);
  RenderArrowPointingAt(draw_list_00,local_48,local_58,3,local_20);
  return;
}

Assistant:

void ImGui::RenderArrowDockMenu(ImDrawList* draw_list, ImVec2 p_min, float sz, ImU32 col)
{
    draw_list->AddRectFilled(p_min + ImVec2(sz * 0.20f, sz * 0.15f), p_min + ImVec2(sz * 0.80f, sz * 0.30f), col);
    RenderArrowPointingAt(draw_list, p_min + ImVec2(sz * 0.50f, sz * 0.85f), ImVec2(sz * 0.30f, sz * 0.40f), ImGuiDir_Down, col);
}